

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

bool __thiscall
tonk::gateway::HTTPRequester::OnTick_IsDisposable(HTTPRequester *this,uint64_t nowUsec)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  Result result;
  uint64_t deltaUsec;
  string *in_stack_ffffffffffffff58;
  ErrorResult *in_stack_ffffffffffffff60;
  uint bytes;
  char *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  Result *in_stack_ffffffffffffff98;
  HTTPRequester *in_stack_ffffffffffffffa0;
  void *local_40;
  ulong local_38;
  bool local_1d;
  undefined1 *local_10;
  void **local_8;
  
  if (((*(byte *)(in_RDI + 0x1a0) & 1) == 0) || (0 < *(int *)(in_RDI + 400))) {
    local_38 = in_RSI - *(long *)(in_RDI + 0x198);
    if (14999999 < local_38) {
      std::allocator<char>::allocator();
      bytes = (uint)((ulong)in_RDI >> 0x20);
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa0,"Connection timeout",
                 (allocator *)&stack0xffffffffffffff9f);
      local_8 = &local_40;
      local_10 = &stack0xffffffffffffffa0;
      pvVar1 = operator_new(0x38);
      ErrorResult::ErrorResult(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_40 = pvVar1;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
      OnDone(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
             in_stack_ffffffffffffff88,bytes);
      Result::~Result((Result *)in_stack_ffffffffffffff60);
    }
    local_1d = false;
  }
  else {
    local_1d = true;
  }
  return local_1d;
}

Assistant:

bool HTTPRequester::OnTick_IsDisposable(uint64_t nowUsec)
{
    // If requester is done and no reference remain:
    if (Done && AsyncRefs <= 0) {
        // It can be deleted now
        return true;
    }

    // Check if timeout has elapsed
    const uint64_t deltaUsec = nowUsec - StartUsec;
    if (deltaUsec >= kTimeoutUsec) {
        Result result("Connection timeout");
        OnDone(result);
    }

    // Check again on the next tick
    return false;
}